

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_proxy_set(JSContext *ctx,JSValue obj,JSAtom atom,JSValue value,JSValue receiver,int flags)

{
  JSValue v;
  JSValue v_00;
  JSValue op2;
  JSValue val;
  JSValue this_obj;
  JSValue op1;
  JSValue func_obj;
  JSValue v_01;
  JSValue val_00;
  JSValue obj_00;
  JSValue v_02;
  JSValue this_obj_00;
  JSValue v_03;
  int iVar1;
  int iVar2;
  BOOL BVar3;
  JSProxyData *pJVar4;
  undefined4 in_ECX;
  JSPropertyDescriptor *in_RDX;
  JSObject *in_RSI;
  JSContext *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  JSValue JVar5;
  uint in_stack_00000018;
  JSPropertyDescriptor desc;
  JSValue args [4];
  int res;
  int ret;
  JSValue atom_val;
  JSValue ret1;
  JSValue method;
  JSProxyData *s;
  undefined8 in_stack_fffffffffffffe88;
  JSAtom atom_00;
  JSValueUnion *desc_00;
  JSContext *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  int64_t in_stack_fffffffffffffea0;
  JSContext *in_stack_fffffffffffffeb0;
  JSValueUnion ctx_00;
  JSValueUnion in_stack_fffffffffffffec0;
  JSValueUnion in_stack_fffffffffffffec8;
  int64_t in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  JSAtom in_stack_fffffffffffffeec;
  JSValue *in_stack_fffffffffffffef0;
  JSContext *in_stack_fffffffffffffef8;
  JSValueUnion in_stack_ffffffffffffff00;
  JSValueUnion in_stack_ffffffffffffff08;
  int64_t local_f0;
  JSValueUnion local_e8;
  int64_t local_e0;
  JSValueUnion local_d8;
  JSValueUnion local_b8;
  int64_t local_b0;
  JSValueUnion local_a8;
  undefined8 in_stack_ffffffffffffff78;
  JSAtom prop;
  JSContext *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int64_t in_stack_ffffffffffffff90;
  JSValueUnion in_stack_ffffffffffffff98;
  int64_t in_stack_ffffffffffffffa0;
  JSValue local_50;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 local_20;
  JSAtom prop_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  prop = (JSAtom)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  atom_00 = (JSAtom)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  ctx_00.ptr = &stack0x00000008;
  local_20 = (undefined4)in_R9;
  prop_00 = (JSAtom)((ulong)in_R9 >> 0x20);
  JVar5.tag = (int64_t)in_stack_ffffffffffffff08.ptr;
  JVar5.u.ptr = in_stack_ffffffffffffff00.ptr;
  pJVar4 = get_proxy_method(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,JVar5,
                            in_stack_fffffffffffffeec);
  if (pJVar4 == (JSProxyData *)0x0) {
    return -1;
  }
  iVar1 = JS_IsUndefined(local_50);
  if (iVar1 != 0) {
    v_03.tag._0_4_ = local_20;
    v_03.u = (JSValueUnion)in_R8;
    v_03.tag._4_4_ = prop_00;
    JS_DupValue(in_RDI,v_03);
    obj_00.tag = in_stack_ffffffffffffffa0;
    obj_00.u.float64 = in_stack_ffffffffffffff98.float64;
    val_00.u._4_4_ = in_stack_ffffffffffffff8c;
    val_00.u.int32 = in_stack_ffffffffffffff88;
    val_00.tag = in_stack_ffffffffffffff90;
    this_obj_00.tag._0_4_ = in_stack_ffffffffffffffc8;
    this_obj_00.u.ptr = pJVar4;
    this_obj_00.tag._4_4_ = in_ECX;
    iVar1 = JS_SetPropertyGeneric
                      (in_stack_ffffffffffffff80,obj_00,prop,val_00,this_obj_00,(int)in_RDI);
    return iVar1;
  }
  JVar5 = JS_AtomToValue(in_stack_fffffffffffffe90,atom_00);
  local_d8 = JVar5.u;
  local_a8 = local_d8;
  iVar1 = JS_IsException(JVar5);
  if (iVar1 != 0) {
    v.u._4_4_ = in_stack_fffffffffffffe9c;
    v.u.int32 = in_stack_fffffffffffffe98;
    v.tag = in_stack_fffffffffffffea0;
    JS_FreeValue(in_stack_fffffffffffffe90,v);
    return -1;
  }
  local_b8 = (pJVar4->target).u;
  local_b0 = (pJVar4->target).tag;
  desc_00 = &local_b8;
  func_obj.tag._0_4_ = in_stack_fffffffffffffee0;
  func_obj.u = (JSValueUnion)in_stack_fffffffffffffed8;
  func_obj.tag._4_4_ = in_stack_fffffffffffffee4;
  this_obj.tag = in_stack_fffffffffffffed0;
  this_obj.u.ptr = in_stack_fffffffffffffec8.ptr;
  JVar5 = JS_CallFree((JSContext *)in_stack_fffffffffffffec0.ptr,func_obj,this_obj,ctx_00._4_4_,
                      (JSValue *)in_stack_ffffffffffffff00.ptr);
  local_e8 = JVar5.u;
  local_e0 = JVar5.tag;
  v_00.u._4_4_ = in_stack_fffffffffffffe9c;
  v_00.u.int32 = in_stack_fffffffffffffe98;
  v_00.tag = in_stack_fffffffffffffea0;
  JS_FreeValue(in_stack_fffffffffffffe90,v_00);
  v_02.tag = local_e0;
  v_02.u.float64 = local_e8.float64;
  iVar1 = JS_IsException(v_02);
  if (iVar1 != 0) {
    return -1;
  }
  val.tag = (int64_t)in_stack_fffffffffffffec8.ptr;
  val.u.ptr = in_stack_fffffffffffffec0.ptr;
  iVar1 = JS_ToBoolFree((JSContext *)ctx_00.ptr,val);
  if (iVar1 == 0) {
    if ((in_stack_00000018 & 0x4000) == 0) {
      if ((in_stack_00000018 & 0x8000) == 0) {
        return 0;
      }
      BVar3 = is_strict_mode(in_RDI);
      if (BVar3 == 0) {
        return iVar1;
      }
    }
    JS_ThrowTypeError(in_RDI,"proxy: cannot set property");
    return -1;
  }
  iVar2 = JS_GetOwnPropertyInternal
                    ((JSContext *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     in_RDX,in_RSI,prop_00);
  if (iVar2 < 0) {
    return -1;
  }
  if (iVar2 == 0) {
    return iVar1;
  }
  if ((in_stack_fffffffffffffee0 & 0x13) == 0) {
    op1.tag = in_stack_fffffffffffffed0;
    op1.u.ptr = in_stack_fffffffffffffec8.ptr;
    op2.tag = (int64_t)in_stack_fffffffffffffec0.ptr;
    op2.u.ptr = ctx_00.ptr;
    BVar3 = js_same_value(in_stack_fffffffffffffeb0,op1,op2);
    if (BVar3 == 0) {
LAB_0017c649:
      js_free_desc(in_stack_fffffffffffffe90,(JSPropertyDescriptor *)desc_00);
      JS_ThrowTypeError(in_RDI,"proxy: inconsistent set");
      return -1;
    }
  }
  else if (((in_stack_fffffffffffffee0 & 0x11) == 0x10) &&
          (v_01.tag = local_f0, v_01.u.float64 = in_stack_ffffffffffffff08.float64,
          iVar2 = JS_IsUndefined(v_01), iVar2 != 0)) goto LAB_0017c649;
  js_free_desc(in_stack_fffffffffffffe90,(JSPropertyDescriptor *)desc_00);
  return iVar1;
}

Assistant:

static int js_proxy_set(JSContext *ctx, JSValueConst obj, JSAtom atom,
                        JSValueConst value, JSValueConst receiver, int flags)
{
    JSProxyData *s;
    JSValue method, ret1, atom_val;
    int ret, res;
    JSValueConst args[4];

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_set);
    if (!s)
        return -1;
    if (JS_IsUndefined(method)) {
        return JS_SetPropertyGeneric(ctx, s->target, atom,
                                     JS_DupValue(ctx, value), receiver,
                                     flags);
    }
    atom_val = JS_AtomToValue(ctx, atom);
    if (JS_IsException(atom_val)) {
        JS_FreeValue(ctx, method);
        return -1;
    }
    args[0] = s->target;
    args[1] = atom_val;
    args[2] = value;
    args[3] = receiver;
    ret1 = JS_CallFree(ctx, method, s->handler, 4, args);
    JS_FreeValue(ctx, atom_val);
    if (JS_IsException(ret1))
        return -1;
    ret = JS_ToBoolFree(ctx, ret1);
    if (ret) {
        JSPropertyDescriptor desc;
        res = JS_GetOwnPropertyInternal(ctx, &desc, JS_VALUE_GET_OBJ(s->target), atom);
        if (res < 0)
            return -1;
        if (res) {
            if ((desc.flags & (JS_PROP_GETSET | JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)) == 0) {
                if (!js_same_value(ctx, desc.value, value)) {
                    goto fail;
                }
            } else if ((desc.flags & (JS_PROP_GETSET | JS_PROP_CONFIGURABLE)) == JS_PROP_GETSET && JS_IsUndefined(desc.setter)) {
                fail:
                    js_free_desc(ctx, &desc);
                    JS_ThrowTypeError(ctx, "proxy: inconsistent set");
                    return -1;
            }
            js_free_desc(ctx, &desc);
        }
    } else {
        if ((flags & JS_PROP_THROW) ||
            ((flags & JS_PROP_THROW_STRICT) && is_strict_mode(ctx))) {
            JS_ThrowTypeError(ctx, "proxy: cannot set property");
            return -1;
        }
    }
    return ret;
}